

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O2

string * cmStrCat<char_const(&)[31],std::__cxx11::string&>
                   (string *__return_storage_ptr__,char (*a) [31],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b)

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_c0;
  string_view local_a8;
  string *local_98;
  cmAlphaNum local_90;
  cmAlphaNum local_58;
  
  cmAlphaNum::cmAlphaNum(&local_58,*a);
  local_c0.first = cmAlphaNum::View(&local_58);
  local_c0.second = local_58.RValueString_;
  local_90.RValueString_ = (string *)0x0;
  local_90.View_._M_str = (b->_M_dataplus)._M_p;
  local_90.View_._M_len = b->_M_string_length;
  local_a8 = cmAlphaNum::View(&local_90);
  local_98 = local_90.RValueString_;
  views._M_len = 2;
  views._M_array = &local_c0;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}